

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O1

void __thiscall Assimp::AMFImporter::ParseNode_Constellation(AMFImporter *this)

{
  size_t *psVar1;
  CAMFImporter_NodeElement *pCVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement *pCVar7;
  _List_node_base *p_Var8;
  undefined8 extraout_RAX;
  AMFImporter *this_00;
  char *__end;
  uint uVar9;
  ulong uVar10;
  string an;
  string id;
  allocator local_81;
  _Alloc_hider local_80;
  AMFImporter *local_60;
  _Base_ptr local_58;
  char *local_50;
  undefined1 local_48;
  CAMFImporter_NodeElement *local_38;
  
  local_58 = (_Base_ptr)&stack0xffffffffffffffb8;
  local_50 = (char *)0x0;
  local_48 = _S_red;
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar4) {
    uVar10 = 0;
    local_60 = this;
    do {
      iVar5 = (*local_60->mReader->_vptr_IIrrXMLReader[5])(local_60->mReader,uVar10);
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff80,(char *)CONCAT44(extraout_var,iVar5),&local_81);
      iVar5 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff80);
      if (iVar5 != 0) goto LAB_003d6696;
      iVar5 = (*local_60->mReader->_vptr_IIrrXMLReader[6])();
      pcVar3 = local_50;
      strlen((char *)CONCAT44(extraout_var_00,iVar5));
      std::__cxx11::string::_M_replace
                ((ulong)&stack0xffffffffffffffa8,0,pcVar3,CONCAT44(extraout_var_00,iVar5));
      if (local_80._M_p != &stack0xffffffffffffff90) {
        operator_delete(local_80._M_p);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
      this = local_60;
    } while (uVar4 != uVar9);
  }
  pCVar7 = (CAMFImporter_NodeElement *)operator_new(0x50);
  pCVar2 = this->mNodeElement_Cur;
  pCVar7->Type = 1;
  (pCVar7->ID)._M_dataplus._M_p = (pointer)&(pCVar7->ID).field_2;
  (pCVar7->ID)._M_string_length = 0;
  (pCVar7->ID).field_2._M_local_buf[0] = '\0';
  pCVar7->Parent = pCVar2;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pCVar7->Child;
  (pCVar7->Child).
  super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>._M_impl.
  _M_node._M_size = 0;
  pCVar7->_vptr_CAMFImporter_NodeElement = (_func_int **)&PTR__CAMFImporter_NodeElement_0081f4b0;
  if (local_50 != (char *)0x0) {
    std::__cxx11::string::_M_assign((string *)&pCVar7->ID);
  }
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  pCVar2 = this->mNodeElement_Cur;
  if ((char)iVar5 == '\0') {
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)pCVar7;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    this->mNodeElement_Cur = pCVar7;
    local_38 = pCVar7;
    do {
      do {
        while( true ) {
          iVar5 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((char)iVar5 == '\0') goto LAB_003d6671;
          iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar6 != 1) break;
          local_80._M_p = &stack0xffffffffffffff90;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&stack0xffffffffffffff80,"instance","");
          (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar5 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff80);
          if (local_80._M_p != &stack0xffffffffffffff90) {
            operator_delete(local_80._M_p);
          }
          if (iVar5 == 0) {
            ParseNode_Instance(this);
          }
          else {
            local_80._M_p = &stack0xffffffffffffff90;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&stack0xffffffffffffff80,"metadata","");
            (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar5 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff80);
            if (local_80._M_p != &stack0xffffffffffffff90) {
              operator_delete(local_80._M_p);
            }
            if (iVar5 == 0) {
              ParseNode_Metadata(this);
            }
            else {
              local_80._M_p = &stack0xffffffffffffff90;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xffffffffffffff80,"constellation","");
              XML_CheckNode_SkipUnsupported(this,(string *)&stack0xffffffffffffff80);
              if (local_80._M_p != &stack0xffffffffffffff90) {
                operator_delete(local_80._M_p);
              }
            }
          }
        }
        iVar6 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar6 != 2);
      local_80._M_p = &stack0xffffffffffffff90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff80,"constellation","");
      (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar6 = std::__cxx11::string::compare((char *)&stack0xffffffffffffff80);
      if (local_80._M_p != &stack0xffffffffffffff90) {
        operator_delete(local_80._M_p);
      }
    } while (iVar6 != 0);
    if ((char)iVar5 == '\0') {
LAB_003d6671:
      local_80._M_p = &stack0xffffffffffffff90;
      this_00 = (AMFImporter *)&stack0xffffffffffffff80;
      std::__cxx11::string::_M_construct<char_const*>((string *)this_00,"constellation","");
      Throw_CloseNotFound(this_00,(string *)&stack0xffffffffffffff80);
LAB_003d6696:
      Throw_IncorrectAttr(local_60,(string *)&stack0xffffffffffffff80);
      if (local_58 != (_Base_ptr)&stack0xffffffffffffffb8) {
        operator_delete(local_58);
      }
      _Unwind_Resume(extraout_RAX);
    }
    pCVar7 = local_38;
    if (this->mNodeElement_Cur != (CAMFImporter_NodeElement *)0x0) {
      this->mNodeElement_Cur = this->mNodeElement_Cur->Parent;
    }
  }
  else {
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)pCVar7;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(pCVar2->Child).
              super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  p_Var8 = (_List_node_base *)operator_new(0x18);
  p_Var8[1]._M_next = (_List_node_base *)pCVar7;
  std::__detail::_List_node_base::_M_hook(p_Var8);
  psVar1 = &(this->mNodeElement_List).
            super__List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if (local_58 != (_Base_ptr)&stack0xffffffffffffffb8) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void AMFImporter::ParseNode_Constellation()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <constellation>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new grouping object.
	ne = new CAMFImporter_NodeElement_Constellation(mNodeElement_Cur);

	CAMFImporter_NodeElement_Constellation& als = *((CAMFImporter_NodeElement_Constellation*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("constellation");
			if(XML_CheckNode_NameEqual("instance")) { ParseNode_Instance(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("constellation");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}